

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hsort.scat.c
# Opt level: O0

void ga_sort_scat(Integer *pn,void *v,Integer *i,Integer *j,Integer *base,Integer type)

{
  Integer *j_00;
  Integer *in_RCX;
  Integer *in_RDX;
  SingleComplex *in_RSI;
  Integer *in_RDI;
  float *in_R8;
  Integer *in_R9;
  Integer *unaff_retaddr;
  Integer in_stack_00000168;
  char *in_stack_00000170;
  
  j_00 = (Integer *)((long)in_R9 + -0x3e9);
  switch(j_00) {
  case (Integer *)0x0:
    ga_sort_scat_int_(in_RCX,(int *)in_R8,in_R9,j_00,(Integer *)0x2589b3);
    break;
  case (Integer *)0x1:
    ga_sort_scat_long_(in_RDI,(long *)in_RSI,in_RDX,in_RCX,(Integer *)in_R8);
    break;
  case (Integer *)0x2:
    ga_sort_scat_flt_(in_RCX,in_R8,in_R9,j_00,(Integer *)0x2589d3);
    break;
  case (Integer *)0x3:
    ga_sort_scat_dbl_(in_RDI,(DoublePrecision *)in_RSI,in_RDX,in_RCX,(Integer *)in_R8);
    break;
  default:
    pnga_error(in_stack_00000170,in_stack_00000168);
    break;
  case (Integer *)0x5:
    ga_sort_scat_scpl_(in_RDI,in_RSI,in_RDX,in_RCX,(Integer *)in_R8);
    break;
  case (Integer *)0x6:
    ga_sort_scat_dcpl_(base,(DoubleComplex *)type,unaff_retaddr,in_RDI,(Integer *)in_RSI);
  }
  return;
}

Assistant:

void ga_sort_scat(pn, v, i, j, base, type)
     Integer *pn;
     void    *v;
     Integer *i;
     Integer *j;
     Integer *base;
     Integer type;
{ 
   switch (type){
     case C_DBL:  ga_sort_scat_dbl_(pn, (double*)v, i,j,base);break;
     case C_DCPL: ga_sort_scat_dcpl_(pn, (DoubleComplex*)v, i,j,base); break;
     case C_SCPL: ga_sort_scat_scpl_(pn, (SingleComplex*)v, i,j,base); break;
     case C_INT:  ga_sort_scat_int_(pn, (int*)v, i, j, base); break;
     case C_FLOAT:  ga_sort_scat_flt_(pn, (float*)v, i, j, base); break; 
     case C_LONG:  ga_sort_scat_long_(pn, (long*)v, i, j, base); break;
     default:        pnga_error("ERROR:ga_sort_scat: wrong type",type);
   } 
}